

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.cpp
# Opt level: O0

ssize_t __thiscall
jaegertracing::thrift::AggregationValidator_validateTrace_args::write
          (AggregationValidator_validateTrace_args *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  TProtocol *prot;
  TOutputRecursionTracker local_28;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  TProtocol *oprot_local;
  AggregationValidator_validateTrace_args *this_local;
  
  prot = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  tracker.prot_._4_4_ = 0;
  apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker(&local_28,prot);
  uVar1 = apache::thrift::protocol::TProtocol::writeStructBegin
                    (prot,"AggregationValidator_validateTrace_args");
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldBegin(prot,"traceId",T_STRING,1);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeString(prot,&this->traceId);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeFieldStop(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar1;
  uVar1 = apache::thrift::protocol::TProtocol::writeStructEnd(prot);
  uVar2 = uVar1 + tracker.prot_._4_4_;
  tracker.prot_._4_4_ = uVar2;
  apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker(&local_28);
  return (ulong)uVar2;
}

Assistant:

uint32_t AggregationValidator_validateTrace_args::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("AggregationValidator_validateTrace_args");

  xfer += oprot->writeFieldBegin("traceId", ::apache::thrift::protocol::T_STRING, 1);
  xfer += oprot->writeString(this->traceId);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}